

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load_raw<char>(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *this,enable_if_t<std::is_same<char,_char>::value,_handle> src)

{
  PyTypeObject *pPVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long *local_40 [2];
  long local_30 [2];
  
  pPVar1 = (src.m_ptr)->ob_type;
  if ((pPVar1->tp_flags & 0x8000000) == 0) {
    if ((pPVar1 != (PyTypeObject *)&PyByteArray_Type) &&
       (iVar2 = PyType_IsSubtype(pPVar1,&PyByteArray_Type), iVar2 == 0)) {
      return false;
    }
    lVar3 = PyByteArray_AsString(src.m_ptr);
    if (lVar3 == 0) {
      pybind11_fail("Unexpected PyByteArray_AsString() failure.");
    }
    lVar4 = PyByteArray_Size(src.m_ptr);
  }
  else {
    lVar3 = PyBytes_AsString(src.m_ptr);
    if (lVar3 == 0) {
      pybind11_fail("Unexpected PYBIND11_BYTES_AS_STRING() failure.");
    }
    lVar4 = PyBytes_Size(src.m_ptr);
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,lVar3,lVar3 + lVar4);
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return true;
}

Assistant:

bool load_raw(enable_if_t<std::is_same<C, char>::value, handle> src) {
        if (PYBIND11_BYTES_CHECK(src.ptr())) {
            // We were passed raw bytes; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytes = PYBIND11_BYTES_AS_STRING(src.ptr());
            if (!bytes) {
                pybind11_fail("Unexpected PYBIND11_BYTES_AS_STRING() failure.");
            }
            value = StringType(bytes, (size_t) PYBIND11_BYTES_SIZE(src.ptr()));
            return true;
        }
        if (PyByteArray_Check(src.ptr())) {
            // We were passed a bytearray; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytearray = PyByteArray_AsString(src.ptr());
            if (!bytearray) {
                pybind11_fail("Unexpected PyByteArray_AsString() failure.");
            }
            value = StringType(bytearray, (size_t) PyByteArray_Size(src.ptr()));
            return true;
        }

        return false;
    }